

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  utf8proc_int32_t uc_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  utf8proc_property_t *puVar4;
  utf8proc_property_t *puVar5;
  utf8proc_ssize_t uVar6;
  long lStack_a0;
  utf8proc_int32_t uc_1;
  utf8proc_ssize_t wpos_2;
  utf8proc_ssize_t rpos_2;
  int idx;
  int sidx;
  utf8proc_int32_t hangul_tindex;
  utf8proc_int32_t hangul_vindex;
  utf8proc_int32_t hangul_sindex;
  utf8proc_int32_t hangul_lindex;
  utf8proc_int32_t composition;
  utf8proc_ssize_t wpos_1;
  utf8proc_ssize_t rpos_1;
  utf8proc_propval_t max_combining_class;
  utf8proc_property_t *current_property;
  utf8proc_property_t *starter_property;
  int *piStack_40;
  utf8proc_int32_t current_char;
  utf8proc_int32_t *starter;
  long lStack_30;
  utf8proc_int32_t uc;
  utf8proc_ssize_t wpos;
  utf8proc_ssize_t rpos;
  utf8proc_ssize_t uStack_18;
  utf8proc_option_t options_local;
  utf8proc_ssize_t length_local;
  utf8proc_int32_t *buffer_local;
  
  uStack_18 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    lStack_30 = 0;
    for (wpos = 0; wpos < length; wpos = wpos + 1) {
      iVar1 = buffer[wpos];
      if (((iVar1 == 0xd) && (wpos < length + -1)) && (buffer[wpos + 1] == 10)) {
        wpos = wpos + 1;
      }
      if ((((iVar1 == 10) || (iVar1 == 0xd)) || (iVar1 == 0x85)) ||
         (((options & UTF8PROC_STRIPCC) != 0 && ((iVar1 == 0xb || (iVar1 == 0xc)))))) {
        if ((options & UTF8PROC_NLF2LS) == 0) {
          if ((options & UTF8PROC_NLF2PS) == 0) {
            buffer[lStack_30] = 0x20;
          }
          else {
            buffer[lStack_30] = 0x2029;
          }
        }
        else if ((options & UTF8PROC_NLF2PS) == 0) {
          buffer[lStack_30] = 0x2028;
        }
        else {
          buffer[lStack_30] = 10;
        }
        lStack_30 = lStack_30 + 1;
      }
      else if (((options & UTF8PROC_STRIPCC) == 0) ||
              ((0x1f < iVar1 && ((iVar1 < 0x7f || (0x9f < iVar1)))))) {
        buffer[lStack_30] = iVar1;
        lStack_30 = lStack_30 + 1;
      }
      else if (iVar1 == 9) {
        buffer[lStack_30] = 0x20;
        lStack_30 = lStack_30 + 1;
      }
    }
    uStack_18 = lStack_30;
  }
  if ((options & UTF8PROC_COMPOSE) != 0) {
    piStack_40 = (int *)0x0;
    current_property = (utf8proc_property_t *)0x0;
    rpos_1._6_2_ = -1;
    _hangul_lindex = 0;
    for (wpos_1 = 0; wpos_1 < uStack_18; wpos_1 = wpos_1 + 1) {
      uc_00 = buffer[wpos_1];
      puVar4 = unsafe_get_property(uc_00);
      if ((piStack_40 == (int *)0x0) || (puVar4->combining_class <= rpos_1._6_2_)) {
LAB_0019025c:
        buffer[_hangul_lindex] = uc_00;
        if (puVar4->combining_class == 0) {
          piStack_40 = buffer + _hangul_lindex;
          current_property = (utf8proc_property_t *)0x0;
          rpos_1._6_2_ = -1;
        }
        else if (rpos_1._6_2_ < puVar4->combining_class) {
          rpos_1._6_2_ = puVar4->combining_class;
        }
        _hangul_lindex = _hangul_lindex + 1;
      }
      else {
        iVar1 = *piStack_40 + -0x1100;
        if ((iVar1 < 0) ||
           (((0x12 < iVar1 || (iVar2 = uc_00 + -0x1161, iVar2 < 0)) || (0x14 < iVar2)))) {
          iVar1 = *piStack_40 + -0xac00;
          if (((iVar1 < 0) || (0x2ba3 < iVar1)) ||
             ((iVar1 % 0x1c != 0 || ((iVar1 = uc_00 + -0x11a7, iVar1 < 0 || (0x1b < iVar1)))))) {
            if (current_property == (utf8proc_property_t *)0x0) {
              current_property = unsafe_get_property(*piStack_40);
            }
            if (((current_property->comb_index < 0x8000) && (puVar4->comb_index != 0xffff)) &&
               (0x7fff < puVar4->comb_index)) {
              uVar3 = (uint)current_property->comb_index;
              iVar1 = (puVar4->comb_index & 0x3fff) - (uint)utf8proc_combinations[(int)uVar3];
              if ((-1 < iVar1) && (iVar1 <= (int)(uint)utf8proc_combinations[(int)(uVar3 + 1)])) {
                iVar1 = uVar3 + 2 + iVar1;
                if ((puVar4->comb_index & 0x4000) == 0) {
                  hangul_sindex = (utf8proc_int32_t)utf8proc_combinations[iVar1];
                }
                else {
                  hangul_sindex =
                       CONCAT22(utf8proc_combinations[iVar1],utf8proc_combinations[iVar1 + 1]);
                }
                if ((0 < hangul_sindex) &&
                   (((options & UTF8PROC_STABLE) == 0 ||
                    (puVar5 = unsafe_get_property(hangul_sindex),
                    (*(ushort *)&puVar5->field_0x14 >> 1 & 1) == 0)))) {
                  *piStack_40 = hangul_sindex;
                  current_property = (utf8proc_property_t *)0x0;
                  goto LAB_001902c0;
                }
              }
            }
            goto LAB_0019025c;
          }
          *piStack_40 = iVar1 + *piStack_40;
          current_property = (utf8proc_property_t *)0x0;
        }
        else {
          *piStack_40 = (iVar1 * 0x15 + iVar2) * 0x1c + 0xac00;
          current_property = (utf8proc_property_t *)0x0;
        }
      }
LAB_001902c0:
    }
    uStack_18 = _hangul_lindex;
  }
  lStack_a0 = 0;
  if ((options & UTF8PROC_CHARBOUND) == 0) {
    for (wpos_2 = 0; wpos_2 < uStack_18; wpos_2 = wpos_2 + 1) {
      uVar6 = utf8proc_encode_char(buffer[wpos_2],(utf8proc_uint8_t *)((long)buffer + lStack_a0));
      lStack_a0 = uVar6 + lStack_a0;
    }
  }
  else {
    for (wpos_2 = 0; wpos_2 < uStack_18; wpos_2 = wpos_2 + 1) {
      uVar6 = unsafe_encode_char(buffer[wpos_2],(utf8proc_uint8_t *)((long)buffer + lStack_a0));
      lStack_a0 = uVar6 + lStack_a0;
    }
  }
  *(undefined1 *)((long)buffer + lStack_a0) = 0;
  return lStack_a0;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = (current_property->comb_index & 0x3FFF) - utf8proc_combinations[sidx];
          if (idx >= 0 && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2;
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}